

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O2

void __thiscall Qentem::Tags::TagBit::Clear(TagBit *this)

{
  InLineIfTag *this_00;
  
  switch(this->type_) {
  case Variable:
  case RawVariable:
    this_00 = (InLineIfTag *)this->storage_;
    break;
  case Math:
    this_00 = (InLineIfTag *)this->storage_;
    if (this_00 != (InLineIfTag *)0x0) {
      Array<Qentem::QExpression>::~Array((Array<Qentem::QExpression> *)this_00);
    }
    break;
  case SuperVariable:
  case Loop:
    this_00 = (InLineIfTag *)this->storage_;
    if (this_00 != (InLineIfTag *)0x0) {
      Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)this_00);
    }
    break;
  case InLineIf:
    this_00 = (InLineIfTag *)this->storage_;
    if (this_00 != (InLineIfTag *)0x0) {
      InLineIfTag::~InLineIfTag(this_00);
    }
    break;
  case If:
    this_00 = (InLineIfTag *)this->storage_;
    if (this_00 != (InLineIfTag *)0x0) {
      Array<Qentem::Tags::IfTagCase>::~Array((Array<Qentem::Tags::IfTagCase> *)this_00);
    }
    break;
  default:
    return;
  }
  Memory::Deallocate(this_00);
  return;
}

Assistant:

inline TagType GetType() const noexcept {
        return type_;
    }